

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.c
# Opt level: O3

pnm_t * pnm_create_from_file(char *path)

{
  byte bVar1;
  bool bVar2;
  FILE *__stream;
  pnm_t *__ptr;
  char *pcVar3;
  byte *pbVar4;
  uint8_t *__ptr_00;
  size_t sVar5;
  int iVar6;
  uint32_t uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int params [3];
  char tmp [1024];
  int local_444 [3];
  byte local_438;
  char local_437;
  byte local_436 [1030];
  
  __stream = fopen(path,"rb");
  __ptr_00 = (uint8_t *)0x0;
  if (__stream == (FILE *)0x0) {
    return (pnm_t *)0x0;
  }
  __ptr = (pnm_t *)calloc(1,0x20);
  __ptr->format = -1;
  iVar10 = -1;
  lVar11 = 0;
  do {
    if (((int)lVar11 == 2) && (iVar10 == 4)) {
      __ptr->width = local_444[0];
      __ptr->height = local_444[1];
      __ptr->max = local_444[2];
      goto LAB_003d18bc;
    }
    do {
      pcVar3 = fgets((char *)&local_438,0x400,__stream);
      if (pcVar3 == (char *)0x0) goto LAB_003d1994;
    } while (local_438 == 0x23);
    pbVar4 = &local_438;
    if (local_438 == 0x50 && iVar10 == -1) {
      iVar10 = local_437 + -0x30;
      __ptr->format = iVar10;
      pbVar4 = local_436;
      if (2 < (int)local_437 - 0x34U) {
        __assert_fail("pnm->format == PNM_FORMAT_GRAY || pnm->format == PNM_FORMAT_RGB || pnm->format == PNM_FORMAT_BINARY"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                      ,0x3c,"pnm_t *pnm_create_from_file(const char *)");
      }
    }
    lVar11 = (long)(int)lVar11;
    do {
      bVar1 = *pbVar4;
      if (bVar1 == 0x20) {
        do {
          bVar1 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
        } while (bVar1 == 0x20);
      }
      else if (bVar1 == 0) goto LAB_003d1867;
      if ((byte)(bVar1 - 0x3a) < 0xf6) goto LAB_003d1867;
      pbVar4 = pbVar4 + 1;
      iVar6 = 0;
      do {
        iVar6 = (uint)bVar1 + iVar6 * 10 + -0x30;
        bVar1 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      } while ((byte)(bVar1 - 0x30) < 10);
      local_444[lVar11] = iVar6;
      bVar2 = lVar11 < 2;
      lVar11 = lVar11 + 1;
    } while (bVar2);
    lVar11 = 3;
LAB_003d1867:
  } while ((int)lVar11 < 3);
  __ptr->width = local_444[0];
  __ptr->height = local_444[1];
  __ptr->max = local_444[2];
  if (iVar10 == 6) {
    iVar10 = local_444[0];
    iVar6 = 3;
    if (local_444[2] != 0xff) {
      if (local_444[2] != 0xffff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                      ,0x7e,"pnm_t *pnm_create_from_file(const char *)");
      }
      iVar10 = 6;
      iVar6 = local_444[0];
    }
    uVar7 = local_444[1] * iVar6 * iVar10;
    __ptr->buflen = uVar7;
  }
  else {
    if (iVar10 != 5) {
      if (iVar10 == 4) {
LAB_003d18bc:
        iVar10 = local_444[0] + 0xe;
        if (-1 < local_444[0] + 7) {
          iVar10 = local_444[0] + 7;
        }
        __ptr->max = 1;
        uVar9 = (iVar10 >> 3) * local_444[1];
        uVar8 = (ulong)uVar9;
        __ptr->buflen = uVar9;
        __ptr_00 = (uint8_t *)malloc(uVar8);
        __ptr->buf = __ptr_00;
        sVar5 = fread(__ptr_00,1,uVar8,__stream);
        if (sVar5 != uVar8) goto LAB_003d1994;
        goto LAB_003d1908;
      }
      __ptr_00 = (uint8_t *)0x0;
      goto LAB_003d1994;
    }
    if (local_444[2] == 0xffff) {
      uVar7 = local_444[1] * local_444[0] * 2;
    }
    else {
      if (local_444[2] != 0xff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                      ,0x6d,"pnm_t *pnm_create_from_file(const char *)");
      }
      uVar7 = local_444[1] * local_444[0];
    }
    __ptr->buflen = uVar7;
  }
  uVar8 = (ulong)uVar7;
  __ptr_00 = (uint8_t *)malloc(uVar8);
  __ptr->buf = __ptr_00;
  sVar5 = fread(__ptr_00,1,uVar8,__stream);
  if (sVar5 == uVar8) {
LAB_003d1908:
    fclose(__stream);
    return __ptr;
  }
LAB_003d1994:
  fclose(__stream);
  free(__ptr_00);
  free(__ptr);
  return (pnm_t *)0x0;
}

Assistant:

pnm_t *pnm_create_from_file(const char *path)
{
    FILE *f = fopen(path, "rb");
    if (f == NULL)
        return NULL;

    pnm_t *pnm = calloc(1, sizeof(pnm_t));
    pnm->format = -1;

    char tmp[1024];
    int nparams = 0; // will be 3 when we're all done.
    int params[3];

    while (nparams < 3 && !(pnm->format == PNM_FORMAT_BINARY && nparams == 2)) {
        if (fgets(tmp, sizeof(tmp), f) == NULL)
            goto error;

        // skip comments
        if (tmp[0]=='#')
            continue;

        char *p = tmp;

        if (pnm->format == -1 && tmp[0]=='P') {
            pnm->format = tmp[1]-'0';
            assert(pnm->format == PNM_FORMAT_GRAY || pnm->format == PNM_FORMAT_RGB || pnm->format == PNM_FORMAT_BINARY);
            p = &tmp[2];
        }

        // pull integers out of this line until there are no more.
        while (nparams < 3 && *p!=0) {
            while (*p==' ')
                p++;

            // encounter rubbish? (End of line?)
            if (*p < '0' || *p > '9')
                break;

            int acc = 0;
            while (*p >= '0' && *p <= '9') {
                acc = acc*10 + *p - '0';
                p++;
            }

            params[nparams++] = acc;
            p++;
        }
    }

    pnm->width = params[0];
    pnm->height = params[1];
    pnm->max = params[2];

    switch (pnm->format) {
        case PNM_FORMAT_BINARY: {
            // files in the wild sometimes simply don't set max
            pnm->max = 1;

            pnm->buflen = pnm->height * ((pnm->width + 7)  / 8);
            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;

            fclose(f);
            return pnm;
        }

        case PNM_FORMAT_GRAY: {
            if (pnm->max == 255)
                pnm->buflen = pnm->width * pnm->height;
            else if (pnm->max == 65535)
                pnm->buflen = 2 * pnm->width * pnm->height;
            else
                assert(0);

            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;

            fclose(f);
            return pnm;
        }

        case PNM_FORMAT_RGB: {
            if (pnm->max == 255)
                pnm->buflen = pnm->width * pnm->height * 3;
            else if (pnm->max == 65535)
                pnm->buflen = 2 * pnm->width * pnm->height * 3;
            else
                assert(0);

            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;
            fclose(f);
            return pnm;
        }
    }

error:
    fclose(f);

    if (pnm != NULL) {
        free(pnm->buf);
        free(pnm);
    }

    return NULL;
}